

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void color_quantize3(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  JSAMPROW pJVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cquantize[1].finish_pass;
    lVar3 = *(long *)p_Var2;
    lVar4 = *(long *)(p_Var2 + 8);
    lVar5 = *(long *)(p_Var2 + 0x10);
    JVar1 = cinfo->output_width;
    uVar8 = 0;
    do {
      if (JVar1 != 0) {
        pJVar6 = output_buf[uVar8];
        pbVar7 = input_buf[uVar8];
        lVar9 = 0;
        do {
          pJVar6[lVar9] =
               *(char *)(lVar4 + (ulong)pbVar7[1]) + *(char *)(lVar3 + (ulong)*pbVar7) +
               *(char *)(lVar5 + (ulong)pbVar7[2]);
          lVar9 = lVar9 + 1;
          pbVar7 = pbVar7 + 3;
        } while (JVar1 != (JDIMENSION)lVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize3 (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		 JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register int pixcode;
  register JSAMPROW ptrin, ptrout;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode  = GETJSAMPLE(colorindex0[GETJSAMPLE(*ptrin++)]);
      pixcode += GETJSAMPLE(colorindex1[GETJSAMPLE(*ptrin++)]);
      pixcode += GETJSAMPLE(colorindex2[GETJSAMPLE(*ptrin++)]);
      *ptrout++ = (JSAMPLE) pixcode;
    }
  }
}